

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong uVar1;
  TestError *this_00;
  allocator<char> local_349;
  string source;
  allocator<char> local_324;
  allocator<char> local_323;
  allocator<char> local_322;
  allocator<char> local_321;
  InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES> *local_320;
  ulong local_318;
  string *local_310;
  string *local_308;
  string *local_300;
  string invalid_uniform_block_shader_source;
  string invalid_buffer_shader_source;
  string output_block_shader_source [6];
  string input_block_shader_source [3];
  string invalid_output_shader_source [6];
  string invalid_input_shader_source [5];
  
  uVar1 = (ulong)tested_shader_type;
  local_320 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_buffer_shader_source,
             "layout(std140) buffer MyBuffer\n{\n    float f;\n    int   i;\n    uint  ui;\n} myBuffers[2][2];\n\nvoid main()\n{\n"
             ,(allocator<char> *)invalid_output_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_input_shader_source,"in  float input_variable",
             (allocator<char> *)invalid_output_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source + 1),"[2][2];\nout float output_variable",
             (allocator<char> *)output_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source + 2),";\n\nvoid main()\n{\n    output_variable",
             (allocator<char> *)input_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source + 3)," = input_variable",
             (allocator<char> *)&invalid_uniform_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source + 4),"[0][0];\n",(allocator<char> *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_output_shader_source,"out float output_variable",
             (allocator<char> *)output_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 1),
             "[2][2];\n\nvoid main()\n{\n    output_variable",
             (allocator<char> *)input_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 2),"[0][0] = 0.0;\n    output_variable",
             (allocator<char> *)&invalid_uniform_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 3),"[0][1] = 1.0;\n    output_variable",
             (allocator<char> *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 4),"[1][0] = 2.0;\n    output_variable",
             &local_349);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source + 5),"[1][1] = 3.0;\n",&local_324);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_uniform_block_shader_source,
             "layout(std140) uniform MyUniformBlock\n{\n    float f;\n    int   i;\n    uint  ui;\n} myUniformBlocks[2][2];\n\nvoid main()\n{\n"
             ,(allocator<char> *)output_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)input_block_shader_source,
             "in  InBlock {\n    float input_variable;\n} in_block",
             (allocator<char> *)output_block_shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input_block_shader_source + 1),
             "[2][2];\nout float output_variable;\n\nvoid main()\n{\n    output_variable = in_block"
             ,(allocator<char> *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input_block_shader_source + 2),"[0][0].input_variable;\n",&local_349);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)output_block_shader_source,
             "out OutBlock {\n    float output_variable;\n} out_block",(allocator<char> *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source + 1),"[2][2];\n\nvoid main()\n{\n    out_block",
             &local_349);
  local_300 = output_block_shader_source + 2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_300,"[0][0].output_variable = 0.0;\n    out_block",&local_324);
  local_308 = output_block_shader_source + 3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_308,"[0][1].output_variable = 1.0;\n    out_block",&local_321);
  local_310 = output_block_shader_source + 4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_310,"[1][0].output_variable = 2.0;\n    out_block",&local_322);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source + 5),"[1][1].output_variable = 3.0;\n",&local_323
            );
  std::__cxx11::string::string((string *)&source,(string *)&invalid_buffer_shader_source);
  local_318 = uVar1;
  switch(uVar1) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b8293c_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&source);
    goto switchD_00b8293c_caseD_0;
  case 3:
    break;
  case 4:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1e99);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((string *)&source);
switchD_00b8293c_caseD_0:
  std::__cxx11::string::append((string *)&source);
  (*(local_320->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[8])(local_320,uVar1,&source);
  std::__cxx11::string::~string((string *)&source);
  if (tested_shader_type == COMPUTE_SHADER_TYPE) {
    std::__cxx11::string::string((string *)&source,(string *)&invalid_uniform_block_shader_source);
    (*(code *)(&DAT_0171be38 + *(int *)(&DAT_0171be38 + local_318 * 4)))();
    return;
  }
  source._M_dataplus._M_p = (pointer)&source.field_2;
  source._M_string_length = 0;
  source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((string *)&source);
  if (tested_shader_type - GEOMETRY_SHADER_TYPE < 3) {
    std::__cxx11::string::append((char *)&source);
  }
  std::__cxx11::string::append((string *)&source);
  if (tested_shader_type == TESSELATION_CONTROL_SHADER_TYPE) {
    std::__cxx11::string::append((char *)&source);
  }
  std::__cxx11::string::append((string *)&source);
  if (tested_shader_type == TESSELATION_CONTROL_SHADER_TYPE) {
    std::__cxx11::string::append((char *)&source);
  }
  std::__cxx11::string::append((string *)&source);
  if ((tested_shader_type == TESSELATION_EVALUATION_SHADER_TYPE) ||
     (tested_shader_type == GEOMETRY_SHADER_TYPE)) {
    std::__cxx11::string::append((char *)&source);
  }
  if (tested_shader_type == TESSELATION_CONTROL_SHADER_TYPE) {
    std::__cxx11::string::append((char *)&source);
  }
  std::__cxx11::string::append((string *)&source);
  (*(code *)(&DAT_0171be08 + *(int *)(&DAT_0171be08 + local_318 * 4)))();
  return;
}

Assistant:

void InteractionInterfaceArrays<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	/* Shader source with invalid buffer (buffer cannot be of arrays of arrays type). */
	const std::string invalid_buffer_shader_source = "layout(std140) buffer MyBuffer\n"
													 "{\n"
													 "    float f;\n"
													 "    int   i;\n"
													 "    uint  ui;\n"
													 "} myBuffers[2][2];\n\n"
													 "void main()\n"
													 "{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string invalid_input_shader_source[] = { "in  float input_variable", "[2][2];\n"
																					"out float output_variable",
														";\n\n"
														"void main()\n"
														"{\n"
														"    output_variable",
														" = input_variable", "[0][0];\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string invalid_output_shader_source[] = { "out float output_variable", "[2][2];\n\n"
																					  "void main()\n"
																					  "{\n"
																					  "    output_variable",
														 "[0][0] = 0.0;\n"
														 "    output_variable",
														 "[0][1] = 1.0;\n"
														 "    output_variable",
														 "[1][0] = 2.0;\n"
														 "    output_variable",
														 "[1][1] = 3.0;\n" };
	/* Shader source with invalid uniform block (uniform block cannot be of arrays of arrays type). */
	const std::string invalid_uniform_block_shader_source = "layout(std140) uniform MyUniformBlock\n"
															"{\n"
															"    float f;\n"
															"    int   i;\n"
															"    uint  ui;\n"
															"} myUniformBlocks[2][2];\n\n"
															"void main()\n"
															"{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string input_block_shader_source[] = { "in  InBlock {\n"
													  "    float input_variable;\n"
													  "} in_block",

													  "[2][2];\n"
													  "out float output_variable;\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    output_variable = in_block",
													  "[0][0].input_variable;\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string output_block_shader_source[] = { "out OutBlock {\n"
													   "    float output_variable;\n"
													   "} out_block",
													   "[2][2];\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    out_block",
													   "[0][0].output_variable = 0.0;\n"
													   "    out_block",
													   "[0][1].output_variable = 1.0;\n"
													   "    out_block",
													   "[1][0].output_variable = 2.0;\n"
													   "    out_block",
													   "[1][1].output_variable = 3.0;\n" };

	/* Verify that buffer arrays of arrays type is rejected. */
	{
		std::string source = invalid_buffer_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that INPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_input_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += invalid_input_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_input_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[3];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[4];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that OUTPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_output_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_output_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that uniform block arrays of arrays type is rejected. */
	{
		std::string source = invalid_uniform_block_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of input blocks are accepted */
	if ((TestCaseBase<API>::VERTEX_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source += input_block_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += input_block_shader_source[1];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		source += input_block_shader_source[2];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of output blocks are accepted */
	if ((TestCaseBase<API>::FRAGMENT_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source = output_block_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += output_block_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}
}